

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O2

yy_state_type yy_get_previous_state(void)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  byte bVar5;
  long lVar6;
  
  pbVar4 = (byte *)yytext;
  uVar2 = yy_start;
LAB_00116422:
  uVar3 = (ulong)uVar2;
  if (yy_c_buf_p <= pbVar4) {
    return uVar2;
  }
  if ((ulong)*pbVar4 == 0) {
    bVar5 = 1;
  }
  else {
    bVar5 = ""[*pbVar4];
  }
  if ((0xbfffbc610800001fU >> (uVar3 & 0x3f) & 1) == 0) {
    yy_last_accepting_state = uVar2;
    yy_last_accepting_cpos = (char *)pbVar4;
  }
  do {
    do {
      iVar1 = (int)uVar3;
      lVar6 = (long)yy_base[iVar1] + (ulong)bVar5;
      if (iVar1 == yy_chk[lVar6]) {
        uVar2 = (uint)yy_nxt[lVar6];
        pbVar4 = pbVar4 + 1;
        goto LAB_00116422;
      }
      uVar3 = (ulong)(uint)(int)yy_def[iVar1];
    } while (yy_def[iVar1] < 0x40);
    bVar5 = ""[bVar5];
  } while( true );
}

Assistant:

static yy_state_type yy_get_previous_state (void)
{
	yy_state_type yy_current_state;
	char *yy_cp;
    
	yy_current_state = (yy_start);

	for ( yy_cp = (yytext_ptr) + YY_MORE_ADJ; yy_cp < (yy_c_buf_p); ++yy_cp )
		{
		YY_CHAR yy_c = (*yy_cp ? yy_ec[YY_SC_TO_UI(*yy_cp)] : 1);
		if ( yy_accept[yy_current_state] )
			{
			(yy_last_accepting_state) = yy_current_state;
			(yy_last_accepting_cpos) = yy_cp;
			}
		while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
			{
			yy_current_state = (int) yy_def[yy_current_state];
			if ( yy_current_state >= 64 )
				yy_c = yy_meta[yy_c];
			}
		yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
		}

	return yy_current_state;
}